

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::updateContentsRect(QWidgetPrivate *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  WidgetAttribute unaff_retaddr_00;
  QWidget *in_stack_00000008;
  QWidget *q;
  QEvent e;
  QResizeEvent e_1;
  QWidget *in_stack_ffffffffffffff98;
  QEvent *this_00;
  QWidgetPrivate *this_01;
  undefined1 *local_48;
  QLayout *in_stack_ffffffffffffffc0;
  QSize local_38;
  QSize local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar2 = q_func(in_RDI);
  if (in_RDI->layout == (QLayout *)0x0) {
    QWidget::updateGeometry((QWidget *)in_RDI);
  }
  else {
    QLayout::update(in_stack_ffffffffffffffc0);
  }
  bVar1 = QWidget::isVisible((QWidget *)0x377b68);
  if (bVar1) {
    QWidget::update(in_stack_ffffffffffffff98);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = QRect::size((QRect *)this_01);
    local_38 = QRect::size((QRect *)this_01);
    QResizeEvent::QResizeEvent((QResizeEvent *)&local_28,(QSize *)&local_30,(QSize *)&local_38);
    QCoreApplication::sendEvent(&pQVar2->super_QObject,(QEvent *)&local_28);
    QResizeEvent::~QResizeEvent((QResizeEvent *)&local_28);
  }
  else {
    QWidget::setAttribute(in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QEvent *)&local_48;
  QEvent::QEvent(this_00,ContentsRectChange);
  QCoreApplication::sendEvent(&pQVar2->super_QObject,this_00);
  QEvent::~QEvent(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::updateContentsRect()
{
    Q_Q(QWidget);

    if (layout)
        layout->update(); //force activate; will do updateGeometry
    else
        q->updateGeometry();

    if (q->isVisible()) {
        q->update();
        QResizeEvent e(q->data->crect.size(), q->data->crect.size());
        QCoreApplication::sendEvent(q, &e);
    } else {
        q->setAttribute(Qt::WA_PendingResizeEvent, true);
    }

    QEvent e(QEvent::ContentsRectChange);
    QCoreApplication::sendEvent(q, &e);
}